

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O0

bool __thiscall FPolyObj::RotatePolyobj(FPolyObj *this,DAngle *angle,bool fromsave)

{
  double x;
  vertex_t *this_00;
  FBoundingBox bounds;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  TVector2<double> *this_01;
  FPolyVertex *pFVar4;
  vertex_t **ppvVar5;
  side_t **ppsVar6;
  FBoundingBox local_c8;
  TAngle<double> local_a8;
  uint local_a0;
  uint local_9c;
  uint i_2;
  uint i_1;
  undefined1 local_90 [8];
  FPolyVertex torot;
  uint local_6c;
  uint i;
  TAngle<double> local_60;
  undefined1 local_58 [8];
  FBoundingBox oldbounds;
  bool blocked;
  DAngle an;
  bool fromsave_local;
  DAngle *angle_local;
  FPolyObj *this_local;
  
  an.Degrees._7_1_ = fromsave;
  TAngle<double>::TAngle((TAngle<double> *)&stack0xffffffffffffffd0);
  local_58 = (undefined1  [8])(this->Bounds).m_Box[0];
  oldbounds.m_Box[0] = (this->Bounds).m_Box[1];
  oldbounds.m_Box[1] = (this->Bounds).m_Box[2];
  oldbounds.m_Box[2] = (this->Bounds).m_Box[3];
  TAngle<double>::TAngle((TAngle<double> *)&stack0xffffffffffffff98,angle);
  TAngle<double>::operator+(&local_60,&this->Angle);
  TAngle<double>::operator=((TAngle<double> *)&stack0xffffffffffffffd0,&local_60);
  UnLinkPolyobj(this);
  for (local_6c = 0; uVar2 = TArray<vertex_t_*,_vertex_t_*>::Size(&this->Vertices), local_6c < uVar2
      ; local_6c = local_6c + 1) {
    TArray<vertex_t_*,_vertex_t_*>::operator[](&this->Vertices,(ulong)local_6c);
    vertex_t::fPos((vertex_t *)&torot.pos.Y);
    this_01 = &TArray<FPolyVertex,_FPolyVertex>::operator[](&this->PrevPts,(ulong)local_6c)->pos;
    TVector2<double>::operator=(this_01,(TVector2<double> *)&torot.pos.Y);
    pFVar4 = TArray<FPolyVertex,_FPolyVertex>::operator[](&this->OriginalPts,(ulong)local_6c);
    FPolyVertex::FPolyVertex((FPolyVertex *)local_90,pFVar4);
    TAngle<double>::TAngle((TAngle<double> *)&i_2,(TAngle<double> *)&stack0xffffffffffffffd0);
    RotatePt((DAngle *)&i_2,(DVector2 *)local_90,&(this->StartSpot).pos);
    ppvVar5 = TArray<vertex_t_*,_vertex_t_*>::operator[](&this->Vertices,(ulong)local_6c);
    vertex_t::set(*ppvVar5,(double)local_90,torot.pos.X);
  }
  oldbounds.m_Box[3]._7_1_ = 0;
  this->validcount = this->validcount + 1;
  UpdateBBox(this);
  if ((an.Degrees._7_1_ & 1) == 0) {
    for (local_9c = 0; uVar2 = local_9c, uVar3 = TArray<side_t_*,_side_t_*>::Size(&this->Sidedefs),
        uVar2 < uVar3; local_9c = local_9c + 1) {
      ppsVar6 = TArray<side_t_*,_side_t_*>::operator[](&this->Sidedefs,(ulong)local_9c);
      bVar1 = CheckMobjBlocking(this,*ppsVar6);
      if (bVar1) {
        oldbounds.m_Box[3]._7_1_ = 1;
      }
    }
    if ((oldbounds.m_Box[3]._7_1_ & 1) != 0) {
      for (local_a0 = 0; uVar2 = local_a0,
          uVar3 = TArray<vertex_t_*,_vertex_t_*>::Size(&this->Vertices), uVar2 < uVar3;
          local_a0 = local_a0 + 1) {
        ppvVar5 = TArray<vertex_t_*,_vertex_t_*>::operator[](&this->Vertices,(ulong)local_a0);
        this_00 = *ppvVar5;
        pFVar4 = TArray<FPolyVertex,_FPolyVertex>::operator[](&this->PrevPts,(ulong)local_a0);
        x = (pFVar4->pos).X;
        pFVar4 = TArray<FPolyVertex,_FPolyVertex>::operator[](&this->PrevPts,(ulong)local_a0);
        vertex_t::set(this_00,x,(pFVar4->pos).Y);
      }
      UpdateBBox(this);
      LinkPolyobj(this);
      return false;
    }
  }
  TAngle<double>::TAngle(&local_a8,angle);
  TAngle<double>::operator+=(&this->Angle,&local_a8);
  LinkPolyobj(this);
  ClearSubsectorLinks(this);
  FBoundingBox::operator|(&local_c8,&this->Bounds,(FBoundingBox *)local_58);
  bounds.m_Box[1] = local_c8.m_Box[1];
  bounds.m_Box[0] = local_c8.m_Box[0];
  bounds.m_Box[2] = local_c8.m_Box[2];
  bounds.m_Box[3] = local_c8.m_Box[3];
  RecalcActorFloorCeil(this,bounds);
  return true;
}

Assistant:

bool FPolyObj::RotatePolyobj (DAngle angle, bool fromsave)
{
	DAngle an;
	bool blocked;
	FBoundingBox oldbounds = Bounds;

	an = Angle + angle;

	UnLinkPolyobj();

	for(unsigned i=0;i < Vertices.Size(); i++)
	{
		PrevPts[i].pos = Vertices[i]->fPos();
		FPolyVertex torot = OriginalPts[i];
		RotatePt(an, torot.pos, StartSpot.pos);
		Vertices[i]->set(torot.pos.X, torot.pos.Y);
	}
	blocked = false;
	validcount++;
	UpdateBBox();

	// If we are loading a savegame we do not really want to damage actors and be blocked by them. This can also cause crashes when trying to damage incompletely deserialized player pawns.
	if (!fromsave)
	{
		for (unsigned i = 0; i < Sidedefs.Size(); i++)
		{
			if (CheckMobjBlocking(Sidedefs[i]))
			{
				blocked = true;
			}
		}
		if (blocked)
		{
			for(unsigned i=0;i < Vertices.Size(); i++)
			{
				Vertices[i]->set(PrevPts[i].pos.X, PrevPts[i].pos.Y);
			}
			UpdateBBox();
			LinkPolyobj();
			return false;
		}
	}
	Angle += angle;
	LinkPolyobj();
	ClearSubsectorLinks();
	RecalcActorFloorCeil(Bounds | oldbounds);
	return true;
}